

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ublox.h
# Opt level: O0

int SetRoverCfgublox(UBLOX *publox)

{
  undefined4 uVar1;
  int iVar2;
  uchar local_2c0 [3];
  byte local_2bd;
  CFG_NMEA_PL_UBX cfg_nmea_pl;
  int packetlen;
  uchar packet [128];
  int offset;
  int sendbuflen;
  uchar sendbuf [512];
  UBLOX *publox_local;
  
  cfg_nmea_pl.bdsTalkerId[0] = '\0';
  cfg_nmea_pl.bdsTalkerId[1] = '\0';
  cfg_nmea_pl.reserved1[0] = '\0';
  cfg_nmea_pl.reserved1[1] = '\0';
  sendbuf._504_8_ = publox;
  memset(local_2c0,0,0x14);
  local_2c0[1] = 0x23;
  local_2bd = local_2bd & 0xf5 | 10;
  cfg_nmea_pl.flags = (flags_CFG_NMEA_PL_UBX)0x1;
  EncodePacketUBX(cfg_nmea_pl.reserved1 + 2,(int *)cfg_nmea_pl.bdsTalkerId,6,0x17,local_2c0,0x14);
  memcpy(&offset,cfg_nmea_pl.reserved1 + 2,(long)(int)cfg_nmea_pl._12_4_);
  uVar1 = cfg_nmea_pl._12_4_;
  iVar2 = WriteAllRS232Port((RS232PORT *)sendbuf._504_8_,(uint8 *)&offset,cfg_nmea_pl._12_4_);
  if (iVar2 == 0) {
    if ((*(int *)(sendbuf._504_8_ + 0x6e4) != 0) && (*(long *)(sendbuf._504_8_ + 0x318) != 0)) {
      fwrite(&offset,(long)(int)uVar1,1,*(FILE **)(sendbuf._504_8_ + 0x318));
      fflush(*(FILE **)(sendbuf._504_8_ + 0x318));
    }
    publox_local._4_4_ = 0;
  }
  else {
    printf("Error writing data to a ublox. \n");
    publox_local._4_4_ = 1;
  }
  return publox_local._4_4_;
}

Assistant:

inline int SetRoverCfgublox(UBLOX* publox)
{
	unsigned char sendbuf[512];
	int sendbuflen = 0;
	int offset = 0;
	unsigned char packet[128];
	int packetlen = 0;
	//unsigned char cfg_msg_pl[8];
	struct CFG_NMEA_PL_UBX cfg_nmea_pl;

	//// Enable GGA, RMC NMEA messages.
	//memset(cfg_msg_pl, 0, sizeof(cfg_msg_pl));
	//cfg_msg_pl[0] = NMEA_STD_CLASS_UBX;
	//cfg_msg_pl[1] = NMEA_STD_GGA_ID_UBX;
	//cfg_msg_pl[3] = 4; // UART1 rate.
	//cfg_msg_pl[5] = 4; // USB rate.
	//EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, LEN_CFG_MSG_PL_UBX);
	////EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, sizeof(cfg_msg_pl));
	//memcpy(sendbuf+offset, packet, packetlen);
	//offset += packetlen;
	//cfg_msg_pl[1] = NMEA_STD_RMC_ID_UBX;
	//EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, LEN_CFG_MSG_PL_UBX);
	////EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, sizeof(cfg_msg_pl));
	//memcpy(sendbuf+offset, packet, packetlen);
	//offset += packetlen;

	// Set NMEA high precision mode.
	memset(&cfg_nmea_pl, 0, sizeof(cfg_nmea_pl));
	cfg_nmea_pl.nmeaVersion = NMEA_VERSION_2_3_UBX;
	cfg_nmea_pl.flags.consider = 1;
	cfg_nmea_pl.flags.highPrec = 1;
	cfg_nmea_pl.version = 1;
	EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_NMEA_ID_UBX, (unsigned char*)&cfg_nmea_pl, LEN_CFG_NMEA_PL_UBX);
	//EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_NMEA_ID_UBX, (unsigned char*)&cfg_nmea_pl, sizeof(cfg_nmea_pl));
	memcpy(sendbuf+offset, packet, packetlen);
	offset += packetlen;

	//UBX-CFG-PORT set RTCM 3 as Input Protocol and UBX+NMEA(+RTCM3) as Output Protocol...
	
	sendbuflen = offset;

	if (WriteAllRS232Port(&publox->RS232Port, sendbuf, sendbuflen) != EXIT_SUCCESS)
	{
		printf("Error writing data to a ublox. \n");
		return EXIT_FAILURE;
	}
	if ((publox->bSaveRawData)&&(publox->pfSaveFile))
	{
		fwrite(sendbuf, sendbuflen, 1, publox->pfSaveFile);
		fflush(publox->pfSaveFile);
	}

	// Should check ACK...

	return EXIT_SUCCESS;
}